

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_data_writer.cpp
# Opt level: O0

unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true> __thiscall
duckdb::SingleFileTableDataWriter::GetRowGroupWriter
          (SingleFileTableDataWriter *this,RowGroup *row_group)

{
  MetadataWriter *in_RSI;
  __uniq_ptr_impl<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_> in_RDI;
  PartialBlockManager *unaff_retaddr;
  DuckTableEntry *in_stack_00000008;
  unique_ptr<duckdb::SingleFileRowGroupWriter,_std::default_delete<duckdb::SingleFileRowGroupWriter>_>
  *in_stack_ffffffffffffffc8;
  __uniq_ptr_impl<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_> this_00;
  
  this_00._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>.
  super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl =
       in_RDI._M_t.
       super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>
       .super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl;
  make_uniq<duckdb::SingleFileRowGroupWriter,duckdb::DuckTableEntry&,duckdb::PartialBlockManager&,duckdb::SingleFileTableDataWriter&,duckdb::MetadataWriter&>
            (in_stack_00000008,unaff_retaddr,
             (SingleFileTableDataWriter *)
             in_RDI._M_t.
             super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>
             .super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl,in_RSI);
  unique_ptr<duckdb::RowGroupWriter,std::default_delete<duckdb::RowGroupWriter>,true>::
  unique_ptr<duckdb::SingleFileRowGroupWriter,std::default_delete<std::unique_ptr<duckdb::RowGroupWriter,std::default_delete<duckdb::RowGroupWriter>>>,void>
            ((unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
              *)this_00._M_t.
                super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>
                .super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl,
             in_stack_ffffffffffffffc8);
  unique_ptr<duckdb::SingleFileRowGroupWriter,_std::default_delete<duckdb::SingleFileRowGroupWriter>,_true>
  ::~unique_ptr((unique_ptr<duckdb::SingleFileRowGroupWriter,_std::default_delete<duckdb::SingleFileRowGroupWriter>,_true>
                 *)0x1971608);
  return (unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>)
         (_Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>)
         in_RDI._M_t.
         super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>
         .super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<RowGroupWriter> SingleFileTableDataWriter::GetRowGroupWriter(RowGroup &row_group) {
	return make_uniq<SingleFileRowGroupWriter>(table, checkpoint_manager.partial_block_manager, *this,
	                                           table_data_writer);
}